

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP.h
# Opt level: O0

void __thiscall ASDCP::WriterInfo::WriterInfo(WriterInfo *this)

{
  undefined8 uVar1;
  char *pcVar2;
  WriterInfo *this_local;
  
  this->EncryptedEssence = false;
  this->UsesHMAC = false;
  std::__cxx11::string::string((string *)&this->ProductVersion);
  std::__cxx11::string::string((string *)&this->CompanyName);
  std::__cxx11::string::string((string *)&this->ProductName);
  this->LabelSetType = LS_MXF_INTEROP;
  uVar1 = WriterInfo::default_ProductUUID_Data._8_8_;
  *(undefined8 *)this->ProductUUID = WriterInfo::default_ProductUUID_Data._0_8_;
  *(undefined8 *)(this->ProductUUID + 8) = uVar1;
  this->AssetUUID[0] = '\0';
  this->AssetUUID[1] = '\0';
  this->AssetUUID[2] = '\0';
  this->AssetUUID[3] = '\0';
  this->AssetUUID[4] = '\0';
  this->AssetUUID[5] = '\0';
  this->AssetUUID[6] = '\0';
  this->AssetUUID[7] = '\0';
  this->AssetUUID[8] = '\0';
  this->AssetUUID[9] = '\0';
  this->AssetUUID[10] = '\0';
  this->AssetUUID[0xb] = '\0';
  this->AssetUUID[0xc] = '\0';
  this->AssetUUID[0xd] = '\0';
  this->AssetUUID[0xe] = '\0';
  this->AssetUUID[0xf] = '\0';
  this->ContextID[0] = '\0';
  this->ContextID[1] = '\0';
  this->ContextID[2] = '\0';
  this->ContextID[3] = '\0';
  this->ContextID[4] = '\0';
  this->ContextID[5] = '\0';
  this->ContextID[6] = '\0';
  this->ContextID[7] = '\0';
  this->ContextID[8] = '\0';
  this->ContextID[9] = '\0';
  this->ContextID[10] = '\0';
  this->ContextID[0xb] = '\0';
  this->ContextID[0xc] = '\0';
  this->ContextID[0xd] = '\0';
  this->ContextID[0xe] = '\0';
  this->ContextID[0xf] = '\0';
  this->CryptographicKeyID[0] = '\0';
  this->CryptographicKeyID[1] = '\0';
  this->CryptographicKeyID[2] = '\0';
  this->CryptographicKeyID[3] = '\0';
  this->CryptographicKeyID[4] = '\0';
  this->CryptographicKeyID[5] = '\0';
  this->CryptographicKeyID[6] = '\0';
  this->CryptographicKeyID[7] = '\0';
  this->CryptographicKeyID[8] = '\0';
  this->CryptographicKeyID[9] = '\0';
  this->CryptographicKeyID[10] = '\0';
  this->CryptographicKeyID[0xb] = '\0';
  this->CryptographicKeyID[0xc] = '\0';
  this->CryptographicKeyID[0xd] = '\0';
  this->CryptographicKeyID[0xe] = '\0';
  this->CryptographicKeyID[0xf] = '\0';
  std::__cxx11::string::operator=((string *)&this->ProductVersion,"Unreleased ");
  pcVar2 = (char *)ASDCP::Version();
  std::__cxx11::string::operator+=((string *)&this->ProductVersion,pcVar2);
  std::__cxx11::string::operator=((string *)&this->CompanyName,"DCI");
  std::__cxx11::string::operator=((string *)&this->ProductName,"asdcplib");
  return;
}

Assistant:

WriterInfo() : EncryptedEssence(false), UsesHMAC(false), LabelSetType(LS_MXF_INTEROP)
    {
      static byte_t default_ProductUUID_Data[UUIDlen] = {
	0x43, 0x05, 0x9a, 0x1d, 0x04, 0x32, 0x41, 0x01,
	0xb8, 0x3f, 0x73, 0x68, 0x15, 0xac, 0xf3, 0x1d };

      memcpy(ProductUUID, default_ProductUUID_Data, UUIDlen);
      memset(AssetUUID, 0, UUIDlen);
      memset(ContextID, 0, UUIDlen);
      memset(CryptographicKeyID, 0, UUIDlen);

      ProductVersion = "Unreleased ";
      ProductVersion += Version();
      CompanyName = "DCI";
      ProductName = "asdcplib";
    }